

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  ON__INT16 *pOVar1;
  ON__INT16 *local_30;
  char *b;
  bool rc;
  ON__INT16 *p_local;
  size_t count_local;
  ON_BinaryArchive *this_local;
  
  b._7_1_ = true;
  if (this->m_endian == big_endian) {
    local_30 = p;
    p_local = (ON__INT16 *)count;
    if (count != 0) {
      while( true ) {
        pOVar1 = p_local;
        if (b._7_1_ != false) {
          p_local = (ON__INT16 *)((long)p_local + -1);
        }
        if (b._7_1_ == false || pOVar1 == (ON__INT16 *)0x0) break;
        b._7_1_ = WriteByte(this,1,(void *)((long)local_30 + 1));
        if (b._7_1_) {
          b._7_1_ = WriteByte(this,1,local_30);
        }
        local_30 = local_30 + 1;
      }
    }
  }
  else {
    b._7_1_ = WriteByte(this,count << 1,p);
  }
  return b._7_1_;
}

Assistant:

bool
ON_BinaryArchive::WriteInt16(   // Write an array of 16 bit shorts
		size_t count,               // number of shorts to write
		const ON__INT16* p
		)
{
  bool rc = true;
  if (m_endian == ON::endian::big_endian)
  {
    if ( count > 0 ) 
    {
      const char* b = (const char*)p;
      while ( rc && count-- ) 
      {
        rc = WriteByte( 1, b+1 );
        if (rc)
          rc = WriteByte( 1, b );
        b++;
        b++;
      }
    }
  }
  else 
  {
    rc = WriteByte( count<<1, p );
  }
  return rc;
}